

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestInfo * __thiscall testing::TestCase::GetTestInfo(TestCase *this,int i)

{
  pointer piVar1;
  uint uVar2;
  TestInfo *pTVar3;
  
  uVar2 = 0xffffffff;
  if ((-1 < i) &&
     (piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2))) {
    uVar2 = piVar1[(uint)i];
  }
  if ((int)uVar2 < 0) {
    pTVar3 = (TestInfo *)0x0;
  }
  else {
    pTVar3 = (this->test_info_list_).
             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
  }
  return pTVar3;
}

Assistant:

const TestInfo* TestCase::GetTestInfo(int i) const {
  const int index = GetElementOr(test_indices_, i, -1);
  return index < 0 ? NULL : test_info_list_[index];
}